

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O1

void __thiscall Assimp::ColladaLoader::ConvertPath(ColladaLoader *this,aiString *ss)

{
  char *__dest;
  byte bVar1;
  int iVar2;
  char *pcVar3;
  byte bVar4;
  char *pcVar5;
  char *pcVar6;
  byte *pbVar7;
  char *pcVar8;
  byte bVar9;
  uint uVar10;
  char mychar [3];
  byte local_1b [3];
  
  __dest = ss->data;
  if (*(int *)(ss->data + 3) == 0x2f2f3a65 && *(int *)ss->data == 0x656c6966) {
    uVar10 = ss->length - 7;
    ss->length = uVar10;
    memmove(__dest,ss->data + 7,(ulong)uVar10);
    ss->data[uVar10] = '\0';
  }
  if (((*__dest == '/') && (iVar2 = isalpha((int)ss->data[1]), iVar2 != 0)) && (ss->data[2] == ':'))
  {
    uVar10 = ss->length - 1;
    ss->length = uVar10;
    memmove(__dest,ss->data + 1,(ulong)uVar10);
    ss->data[uVar10] = '\0';
  }
  pcVar3 = __dest;
  if ((ulong)ss->length == 0) {
LAB_003bd5d5:
    *pcVar3 = 0;
    ss->length = (int)pcVar3 - (int)__dest;
    return;
  }
  pcVar8 = ss->data + ss->length;
  pcVar5 = __dest;
LAB_003bd53d:
  if ((*pcVar5 == 0x25) && (pcVar6 = pcVar5 + 3, pcVar6 < pcVar8)) {
    local_1b[0] = pcVar5[1];
    local_1b[1] = pcVar5[2];
    local_1b[2] = 0;
    bVar4 = 0;
    pbVar7 = local_1b;
    do {
      bVar1 = *pbVar7;
      if ((byte)(bVar1 - 0x30) < 10) {
        bVar4 = bVar4 << 4 | bVar1 - 0x30;
      }
      else {
        bVar9 = bVar1 + 0xbf;
        if ((5 < bVar9) && (bVar9 = bVar1 + 0x9f, 5 < bVar9)) goto LAB_003bd5be;
        bVar4 = bVar4 * '\x10' + bVar9 + 10;
      }
      pbVar7 = pbVar7 + 1;
    } while( true );
  }
  pcVar6 = pcVar5 + 1;
  *pcVar3 = *pcVar5;
  goto LAB_003bd5c4;
LAB_003bd5be:
  *pcVar3 = bVar4;
LAB_003bd5c4:
  pcVar3 = pcVar3 + 1;
  pcVar8 = __dest + ss->length;
  pcVar5 = pcVar6;
  if (pcVar6 == pcVar8) goto LAB_003bd5d5;
  goto LAB_003bd53d;
}

Assistant:

void ColladaLoader::ConvertPath(aiString& ss)
{
    // TODO: collada spec, p 22. Handle URI correctly.
    // For the moment we're just stripping the file:// away to make it work.
    // Windows doesn't seem to be able to find stuff like
    // 'file://..\LWO\LWO2\MappingModes\earthSpherical.jpg'
    if (0 == strncmp(ss.data, "file://", 7))
    {
        ss.length -= 7;
        memmove(ss.data, ss.data + 7, ss.length);
        ss.data[ss.length] = '\0';
    }

    // Maxon Cinema Collada Export writes "file:///C:\andsoon" with three slashes...
    // I need to filter it without destroying linux paths starting with "/somewhere"
#if defined( _MSC_VER )
    if (ss.data[0] == '/' && isalpha((unsigned char)ss.data[1]) && ss.data[2] == ':') {
#else
    if (ss.data[0] == '/' && isalpha(ss.data[1]) && ss.data[2] == ':') {
#endif
        --ss.length;
        ::memmove(ss.data, ss.data + 1, ss.length);
        ss.data[ss.length] = 0;
    }

    // find and convert all %xy special chars
    char* out = ss.data;
    for (const char* it = ss.data; it != ss.data + ss.length; /**/)
    {
        if (*it == '%' && (it + 3) < ss.data + ss.length)
        {
            // separate the number to avoid dragging in chars from behind into the parsing
            char mychar[3] = { it[1], it[2], 0 };
            size_t nbr = strtoul16(mychar);
            it += 3;
            *out++ = (char)(nbr & 0xFF);
        }
        else
        {
            *out++ = *it++;
        }
    }

    // adjust length and terminator of the shortened string
    *out = 0;
    ss.length = (ptrdiff_t)(out - ss.data);
}

// ------------------------------------------------------------------------------------------------
// Reads a float value from an accessor and its data array.
ai_real ColladaLoader::ReadFloat(const Collada::Accessor& pAccessor, const Collada::Data& pData, size_t pIndex, size_t pOffset) const
{
    // FIXME: (thom) Test for data type here in every access? For the moment, I leave this to the caller
    size_t pos = pAccessor.mStride * pIndex + pAccessor.mOffset + pOffset;
    ai_assert(pos < pData.mValues.size());
    return pData.mValues[pos];
}

// ------------------------------------------------------------------------------------------------
// Reads a string value from an accessor and its data array.
const std::string& ColladaLoader::ReadString(const Collada::Accessor& pAccessor, const Collada::Data& pData, size_t pIndex) const
{
    size_t pos = pAccessor.mStride * pIndex + pAccessor.mOffset;
    ai_assert(pos < pData.mStrings.size());
    return pData.mStrings[pos];
}

// ------------------------------------------------------------------------------------------------
// Collects all nodes into the given array
void ColladaLoader::CollectNodes(const aiNode* pNode, std::vector<const aiNode*>& poNodes) const
{
    poNodes.push_back(pNode);
    for (size_t a = 0; a < pNode->mNumChildren; ++a) {
        CollectNodes(pNode->mChildren[a], poNodes);
    }
}

// ------------------------------------------------------------------------------------------------
// Finds a node in the collada scene by the given name
const Collada::Node* ColladaLoader::FindNode(const Collada::Node* pNode, const std::string& pName) const
{
    if (pNode->mName == pName || pNode->mID == pName)
        return pNode;

    for (size_t a = 0; a < pNode->mChildren.size(); ++a)
    {
        const Collada::Node* node = FindNode(pNode->mChildren[a], pName);
        if (node)
            return node;
    }

    return NULL;
}

// ------------------------------------------------------------------------------------------------
// Finds a node in the collada scene by the given SID
const Collada::Node* ColladaLoader::FindNodeBySID( const Collada::Node* pNode, const std::string& pSID) const {
    if (nullptr == pNode) {
        return nullptr;
    }

    if (pNode->mSID == pSID) {
        return pNode;
    }

    for( size_t a = 0; a < pNode->mChildren.size(); ++a) {
        const Collada::Node* node = FindNodeBySID( pNode->mChildren[a], pSID);
        if (node) {
            return node;
        }
    }

    return nullptr;
}

// ------------------------------------------------------------------------------------------------
// Finds a proper unique name for a node derived from the collada-node's properties.
// The name must be unique for proper node-bone association.
std::string ColladaLoader::FindNameForNode(const Collada::Node* pNode)
{
    // If explicitly requested, just use the collada name.
    if (useColladaName)
    {
        if (!pNode->mName.empty()) {
            return pNode->mName;
        }
        else {
            return format() << "$ColladaAutoName$_" << mNodeNameCounter++;
        }
    }
    else
    {
        // Now setup the name of the assimp node. The collada name might not be
        // unique, so we use the collada ID.
        if (!pNode->mID.empty())
            return pNode->mID;
        else if (!pNode->mSID.empty())
            return pNode->mSID;
        else
        {
            // No need to worry. Unnamed nodes are no problem at all, except
            // if cameras or lights need to be assigned to them.
            return format() << "$ColladaAutoName$_" << mNodeNameCounter++;
        }
    }
}

}